

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ValidPadding::MergeFrom(ValidPadding *this,ValidPadding *from)

{
  LogMessage *other;
  BorderAmounts *this_00;
  undefined1 *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x5427);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if ((from != (ValidPadding *)_ValidPadding_default_instance_) &&
     (from->paddingamounts_ != (BorderAmounts *)0x0)) {
    this_00 = _internal_mutable_paddingamounts(this);
    from_00 = (undefined1 *)from->paddingamounts_;
    if ((BorderAmounts *)from_00 == (BorderAmounts *)0x0) {
      from_00 = _BorderAmounts_default_instance_;
    }
    BorderAmounts::MergeFrom(this_00,(BorderAmounts *)from_00);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ValidPadding::MergeFrom(const ValidPadding& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ValidPadding)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_paddingamounts()) {
    _internal_mutable_paddingamounts()->::CoreML::Specification::BorderAmounts::MergeFrom(from._internal_paddingamounts());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}